

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O2

bool operator==(Person *a,Person *b)

{
  __type _Var1;
  
  if (a->age == b->age) {
    _Var1 = std::operator==(&a->name,&b->name);
    return _Var1;
  }
  return false;
}

Assistant:

bool operator==(const Person& a, const Person& b)
{
  return a.age == b.age && a.name == b.name;
}